

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenFaceNormalsProcess.cpp
# Opt level: O3

bool __thiscall
Assimp::GenFaceNormalsProcess::GenMeshFaceNormals(GenFaceNormalsProcess *this,aiMesh *pMesh)

{
  aiFace *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  aiVector3D *paVar7;
  uint *puVar8;
  aiVector3D *paVar9;
  Logger *this_00;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    if (this->force_ != true) {
      return false;
    }
    operator_delete__(pMesh->mNormals);
  }
  if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Normal vectors are undefined for line and point meshes");
    return false;
  }
  uVar6 = pMesh->mNumVertices;
  uVar10 = (ulong)uVar6 * 0xc;
  paVar9 = (aiVector3D *)operator_new__(uVar10);
  if ((ulong)uVar6 != 0) {
    memset(paVar9,0,((uVar10 - 0xc) / 0xc) * 0xc + 0xc);
  }
  pMesh->mNormals = paVar9;
  if (pMesh->mNumFaces != 0) {
    uVar10 = 0;
    do {
      paVar1 = pMesh->mFaces + uVar10;
      uVar6 = pMesh->mFaces[uVar10].mNumIndices;
      if (uVar6 < 3) {
        if (uVar6 != 0) {
          uVar11 = 0;
          do {
            paVar7 = pMesh->mNormals;
            uVar6 = paVar1->mIndices[uVar11];
            paVar9 = paVar7 + uVar6;
            paVar9->x = NAN;
            paVar9->y = NAN;
            paVar7[uVar6].z = NAN;
            uVar11 = uVar11 + 1;
          } while (uVar11 < paVar1->mNumIndices);
        }
      }
      else {
        paVar9 = pMesh->mVertices;
        puVar8 = paVar1->mIndices;
        uVar6 = puVar8[uVar6 - 1];
        fVar13 = paVar9[puVar8[1]].x - paVar9[*puVar8].x;
        uVar2 = paVar9[puVar8[1]].y;
        uVar4 = paVar9[puVar8[1]].z;
        uVar3 = paVar9[*puVar8].y;
        uVar5 = paVar9[*puVar8].z;
        fVar12 = paVar9[uVar6].y - (float)uVar3;
        fVar15 = paVar9[uVar6].z - (float)uVar5;
        fVar16 = paVar9[uVar6].x - paVar9[*puVar8].x;
        fVar14 = ((float)uVar2 - (float)uVar3) * fVar15 - fVar12 * ((float)uVar4 - (float)uVar5);
        fVar15 = ((float)uVar4 - (float)uVar5) * fVar16 - fVar15 * fVar13;
        fVar12 = fVar12 * fVar13 - fVar16 * ((float)uVar2 - (float)uVar3);
        fVar16 = SQRT(fVar12 * fVar12 + fVar14 * fVar14 + fVar15 * fVar15);
        fVar13 = 1.0 / fVar16;
        if (0.0 < fVar16) {
          fVar14 = fVar14 * fVar13;
          fVar15 = fVar15 * fVar13;
        }
        uVar11 = 0;
        do {
          paVar7 = pMesh->mNormals;
          uVar6 = paVar1->mIndices[uVar11];
          paVar9 = paVar7 + uVar6;
          paVar9->x = fVar14;
          paVar9->y = fVar15;
          paVar7[uVar6].z =
               (float)(~-(uint)(0.0 < fVar16) & (uint)fVar12 |
                      (uint)(fVar13 * fVar12) & -(uint)(0.0 < fVar16));
          uVar11 = uVar11 + 1;
        } while (uVar11 < paVar1->mNumIndices);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < pMesh->mNumFaces);
    return true;
  }
  return true;
}

Assistant:

bool GenFaceNormalsProcess::GenMeshFaceNormals (aiMesh* pMesh)
{
    if (NULL != pMesh->mNormals) {
        if (force_) delete[] pMesh->mNormals;
        else return false;
    }

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))   {
        ASSIMP_LOG_INFO("Normal vectors are undefined for line and point meshes");
        return false;
    }

    // allocate an array to hold the output normals
    pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
    const float qnan = get_qnan();

    // iterate through all faces and compute per-face normals but store them per-vertex.
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)   {
            // either a point or a line -> no well-defined normal vector
            for (unsigned int i = 0;i < face.mNumIndices;++i) {
                pMesh->mNormals[face.mIndices[i]] = aiVector3D(qnan);
            }
            continue;
        }

        const aiVector3D* pV1 = &pMesh->mVertices[face.mIndices[0]];
        const aiVector3D* pV2 = &pMesh->mVertices[face.mIndices[1]];
        const aiVector3D* pV3 = &pMesh->mVertices[face.mIndices[face.mNumIndices-1]];
        const aiVector3D vNor = ((*pV2 - *pV1) ^ (*pV3 - *pV1)).NormalizeSafe();

        for (unsigned int i = 0;i < face.mNumIndices;++i) {
            pMesh->mNormals[face.mIndices[i]] = vNor;
        }
    }
    return true;
}